

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

void __thiscall xLearn::OndiskReader::Initialize(OndiskReader *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *poVar4;
  Parser *this_00;
  void *pvVar5;
  FILE *pFVar6;
  string *in_RSI;
  long in_RDI;
  Reader *in_stack_00000068;
  char *in_stack_000000a8;
  char *in_stack_000000b0;
  string *splitor;
  char *in_stack_ffffffffffffff28;
  Reader *in_stack_ffffffffffffff30;
  allocator *function;
  int line;
  string *in_stack_ffffffffffffff68;
  LogSeverity in_stack_ffffffffffffff74;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  string *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 1) {
    Logger::Logger(&local_14,ERR);
    line = (int)((ulong)in_RDI >> 0x20);
    function = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.cc"
               ,function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Initialize",&local_71);
    poVar3 = Logger::Start(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,line,
                           (string *)function);
    poVar3 = std::operator<<(poVar3,"CHECK_NE failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x120);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"filename.empty()");
    poVar3 = std::operator<<(poVar3," = ");
    bVar2 = (bool)std::__cxx11::string::empty();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"true");
    poVar3 = std::operator<<(poVar3," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar3,true);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_10);
  splitor = (string *)&stack0xffffffffffffff68;
  Reader::check_file_format_abi_cxx11_(in_stack_00000068);
  std::__cxx11::string::c_str();
  this_00 = Reader::CreateParser(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *(Parser **)(in_RDI + 0x90) = this_00;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  if ((*(byte *)(in_RDI + 0x98) & 1) == 0) {
    Parser::setLabel(*(Parser **)(in_RDI + 0x90),false);
  }
  else {
    Parser::setLabel(*(Parser **)(in_RDI + 0x90),true);
  }
  Parser::setSplitor(this_00,splitor);
  pvVar5 = malloc(*(long *)(in_RDI + 200) << 0x14);
  *(void **)(in_RDI + 0xc0) = pvVar5;
  std::__cxx11::string::c_str();
  pFVar6 = OpenFileOrDie(in_stack_000000b0,in_stack_000000a8);
  *(FILE **)(in_RDI + 0xd8) = pFVar6;
  return;
}

Assistant:

void OndiskReader::Initialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
  this->filename_ = filename;
  // Init parser_                                 
  parser_ = CreateParser(check_file_format().c_str());
  if (has_label_) parser_->setLabel(true);
  else parser_->setLabel(false);
  // Set splitor
  parser_->setSplitor(this->splitor_);
  // Allocate memory for block
  try {
    this->block_ = (char*)malloc(block_size_*1024*1024);
  } catch (std::bad_alloc&) {
    LOG(FATAL) << "Cannot allocate enough memory for data  \
                   block. Block size: " 
               << block_size_ << "MB. "
               << "You set change the block size via configuration.";
  }
  // Open file
#ifndef _MSC_VER
  file_ptr_ = OpenFileOrDie(filename_.c_str(), "r");
#else
  file_ptr_ = OpenFileOrDie(filename_.c_str(), "rb");
#endif
}